

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_summon_random(command_conflict *cmd)

{
  wchar_t wVar1;
  source sVar2;
  source origin;
  wchar_t local_18;
  wchar_t local_14;
  wchar_t i;
  wchar_t n;
  command_conflict *cmd_local;
  
  _i = cmd;
  wVar1 = cmd_get_arg_number((command *)cmd,"quantity",&local_14);
  if (wVar1 != L'\0') {
    local_14 = get_quantity("How many monsters? ",L'(');
    if (local_14 < L'\x01') {
      local_14 = L'\x01';
    }
    cmd_set_arg_number((command *)_i,"quantity",local_14);
  }
  for (local_18 = L'\0'; local_18 < local_14; local_18 = local_18 + L'\x01') {
    sVar2 = source_player();
    origin.which = sVar2.which;
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    effect_simple(L'6',origin,"1",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  return;
}

Assistant:

void do_cmd_wiz_summon_random(struct command *cmd)
{
	int n, i;

	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		n = get_quantity("How many monsters? ", 40);
		if (n < 1) n = 1;
		cmd_set_arg_number(cmd, "quantity", n);
	}

	for (i = 0; i < n; i++) {
		effect_simple(EF_SUMMON, source_player(), "1",
			0, 0, 0, 0, 0, NULL);
	}
}